

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void bitset_container_set_range(bitset_container_t *bitset,uint32_t begin,uint32_t end)

{
  uint64_t *puVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  byte bVar6;
  
  if (begin != end) {
    puVar1 = bitset->words;
    uVar2 = begin >> 6;
    uVar4 = -1L << ((byte)begin & 0x3f);
    uVar5 = end - 1 >> 6;
    if (uVar5 - uVar2 == 0) {
      bVar6 = -(char)end;
      uVar4 = (uVar4 << (bVar6 & 0x3f)) >> (bVar6 & 0x3f);
      uVar5 = uVar2;
    }
    else {
      puVar1[uVar2] = puVar1[uVar2] | uVar4;
      if (uVar2 + 1 < uVar5) {
        memset(puVar1 + (ulong)uVar2 + 1,0xff,(ulong)((uVar5 - uVar2) - 2) * 8 + 8);
      }
      uVar4 = 0xffffffffffffffff >> (-(char)end & 0x3fU);
    }
    puVar1[uVar5] = puVar1[uVar5] | uVar4;
  }
  iVar3 = bitset_container_compute_cardinality(bitset);
  bitset->cardinality = iVar3;
  return;
}

Assistant:

void bitset_container_set_range(bitset_container_t *bitset, uint32_t begin,
                                uint32_t end) {
    bitset_set_range(bitset->words, begin, end);
    bitset->cardinality =
        bitset_container_compute_cardinality(bitset);  // could be smarter
}